

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

int aa64_va_parameter_tbid(uint64_t tcr,ARMMMUIdx mmu_idx)

{
  uint32_t uVar1;
  uint64_t uVar2;
  
  if (mmu_idx < 0x23) {
    if ((0x703ef0000U >> ((ulong)mmu_idx & 0x3f) & 1) != 0) {
      uVar2 = extract64(tcr,0x33,2);
      return (int)uVar2;
    }
    if ((ulong)mmu_idx == 0x1b) {
      return 0;
    }
  }
  uVar1 = extract32((uint32_t)tcr,0x1d,1);
  return uVar1 * 3;
}

Assistant:

static int aa64_va_parameter_tbid(uint64_t tcr, ARMMMUIdx mmu_idx)
{
    if (regime_has_2_ranges(mmu_idx)) {
        return extract64(tcr, 51, 2);
    } else if (mmu_idx == ARMMMUIdx_Stage2) {
        return 0; /* VTCR_EL2 */
    } else {
        /* Replicate the single TBID bit so we always have 2 bits.  */
        return extract32(tcr, 29, 1) * 3;
    }
}